

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O1

void Int24_To_Int8_Dither
               (void *destinationBuffer,int destinationStride,void *sourceBuffer,int sourceStride,
               uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  PaInt32 PVar4;
  uchar *src;
  char *dest;
  byte *pbVar5;
  
  if (count != 0) {
    pbVar5 = (byte *)((long)sourceBuffer + 2);
    do {
      bVar1 = pbVar5[-2];
      bVar2 = pbVar5[-1];
      bVar3 = *pbVar5;
      PVar4 = PaUtil_Generate16BitTriangularDither(ditherGenerator);
      *(char *)destinationBuffer =
           (char)(PVar4 + ((uint)bVar3 << 0x17 | (uint)bVar2 << 0xf | (uint)bVar1 << 7) >> 0x17);
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride);
      pbVar5 = pbVar5 + sourceStride * 3;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Int24_To_Int8_Dither(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    unsigned char *src = (unsigned char*)sourceBuffer;
    signed char  *dest = (signed char*)destinationBuffer;
    
    PaInt32 temp, dither;

    while( count-- )
    {

#if defined(PA_LITTLE_ENDIAN)
        temp = (((PaInt32)src[0]) << 8);  
        temp = temp | (((PaInt32)src[1]) << 16);
        temp = temp | (((PaInt32)src[2]) << 24);
#elif defined(PA_BIG_ENDIAN)
        temp = (((PaInt32)src[0]) << 24);
        temp = temp | (((PaInt32)src[1]) << 16);
        temp = temp | (((PaInt32)src[2]) << 8);
#endif

        /* REVIEW */
        dither = PaUtil_Generate16BitTriangularDither( ditherGenerator );
        *dest = (signed char) (((temp >> 1) + dither) >> 23);

        src += sourceStride * 3;
        dest += destinationStride;
    }
}